

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O1

void __thiscall DyndepParserTestBlankLineVersion::Run(DyndepParserTestBlankLineVersion *this)

{
  int iVar1;
  
  iVar1 = g_current_test->assertion_failures_;
  DyndepParserTest::AssertParse(&this->super_DyndepParserTest,"\nninja_dyndep_version = 1\n");
  if (iVar1 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, BlankLineVersion) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"\n"
"ninja_dyndep_version = 1\n"));
}